

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O3

void __thiscall MNS::Server::Server(Server *this)

{
  char *pcVar1;
  _Manager_type p_Var2;
  mapped_type *pmVar3;
  key_type local_3c;
  _Any_data *local_38;
  
  local_38 = (_Any_data *)&this->onHttpRequestHandler;
  *(undefined8 *)&(this->onHttpRequestHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->onHttpRequestHandler).super__Function_base._M_functor + 8) = 0;
  (this->onHttpRequestHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->onHttpRequestHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->onHttpCancelHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->onHttpCancelHandler).super__Function_base._M_functor + 8) = 0;
  (this->onHttpCancelHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->onHttpCancelHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->onHttpListeningHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->onHttpListeningHandler).super__Function_base._M_functor + 8) = 0;
  (this->onHttpListeningHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->onHttpListeningHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->onHttpConnectionHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->onHttpConnectionHandler).super__Function_base._M_functor + 8) = 0;
  (this->onHttpConnectionHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->onHttpConnectionHandler)._M_invoker = (_Invoker_type)0x0;
  local_3c = 100;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("100 Continue\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b095);
  local_3c = 0x65;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("101 Switching Protocols\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b0a4);
  local_3c = 0x66;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("102 Checkpoint\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b0be);
  local_3c = 200;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("200 OK\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b0cf);
  local_3c = 0xc9;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("201 Created\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b0d8);
  local_3c = 0xca;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("202 Accepted\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b0e6);
  local_3c = 0xcb;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("203 Non-Authoritative Information\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b0f5);
  local_3c = 0xcc;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("204 No Content\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b119);
  local_3c = 0xcd;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("205 Reset Content\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b12a);
  local_3c = 0xce;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("206 Partial Content\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b13e);
  local_3c = 300;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("300 Multiple Choices\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b154);
  local_3c = 0x12d;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("301 Moved Permanently\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b16b);
  local_3c = 0x12e;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("302 Found\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b183);
  local_3c = 0x12f;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("303 See Other\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b18f);
  local_3c = 0x130;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("304 Not Modified\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b19f);
  local_3c = 0x132;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("306 Switch Proxy\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b1b2);
  local_3c = 0x133;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("307 Temporary Redirect\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b1c5);
  local_3c = 0x134;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("308 Resume Incomplete\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b1de);
  local_3c = 400;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("400 Bad Request\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b1f6);
  local_3c = 0x191;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("401 Unauthorized\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b208);
  local_3c = 0x192;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("402 Payment Required\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b21b);
  local_3c = 0x193;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("403 Forbidden\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b232);
  local_3c = 0x194;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("404 Not Found\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b242);
  local_3c = 0x195;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("405 Method Not Allowed\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b252);
  local_3c = 0x196;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("406 Not Acceptable\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b26b);
  local_3c = 0x197;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("407 Proxy Authentication Required\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b280);
  local_3c = 0x198;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("408 Request Timeout\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b2a4);
  local_3c = 0x199;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("409 Conflict\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b2ba);
  local_3c = 0x19a;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("410 Gone\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b2c9);
  local_3c = 0x19b;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("411 Length Required\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b2d4);
  local_3c = 0x19c;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("412 Precondition Failed\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b2ea);
  local_3c = 0x19d;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("413 Request Entity Too Large\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b304);
  local_3c = 0x19e;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("414 Request-URI Too Long\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b323);
  local_3c = 0x19f;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("415 Unsupported Media Type\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b33e);
  local_3c = 0x1a0;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("416 Requested Range Not Satisfiable\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b35b);
  local_3c = 0x1a1;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("417 Expectation Failed\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b381);
  local_3c = 500;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("500 Internal Server Error\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b39a);
  local_3c = 0x1f5;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("501 Not Implemented\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b3b6);
  local_3c = 0x1f6;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("502 Bad Gateway\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b3cc);
  local_3c = 0x1f7;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("503 Service Unavailable\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b3de);
  local_3c = 0x1f8;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("504 Gateway Timeout\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b3f8);
  local_3c = 0x1f9;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("505 HTTP Version Not Supported\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b40e);
  local_3c = 0x1ff;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_3c);
  pcVar1 = (char *)pmVar3->_M_string_length;
  strlen("511 Network Authentication Required\r\n");
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar1,0x10b42f);
  loop = (uv_loop_t *)uv_default_loop();
  p_Var2 = (this->onHttpCancelHandler).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->onHttpCancelHandler,(_Any_data *)&this->onHttpCancelHandler,
              __destroy_functor);
    (this->onHttpCancelHandler).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->onHttpCancelHandler)._M_invoker = (_Invoker_type)0x0;
  }
  p_Var2 = (this->onHttpConnectionHandler).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->onHttpConnectionHandler,
              (_Any_data *)&this->onHttpConnectionHandler,__destroy_functor);
    (this->onHttpConnectionHandler).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->onHttpConnectionHandler)._M_invoker = (_Invoker_type)0x0;
  }
  p_Var2 = (this->onHttpRequestHandler).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)(local_38,local_38,__destroy_functor);
    (this->onHttpRequestHandler).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->onHttpRequestHandler)._M_invoker = (_Invoker_type)0x0;
  }
  this->listeningSocket = 0;
  this->timer_h = (uv_timer_t *)0x0;
  return;
}

Assistant:

MNS::Server::Server() {
	MNS::Server::response_msgs[100] = "100 Continue\r\n";
	MNS::Server::response_msgs[101] = "101 Switching Protocols\r\n";
	MNS::Server::response_msgs[102] = "102 Checkpoint\r\n";

	MNS::Server::response_msgs[200] = "200 OK\r\n";
	MNS::Server::response_msgs[201] = "201 Created\r\n";
	MNS::Server::response_msgs[202] = "202 Accepted\r\n";
	MNS::Server::response_msgs[203] = "203 Non-Authoritative Information\r\n";
	MNS::Server::response_msgs[204] = "204 No Content\r\n";
	MNS::Server::response_msgs[205] = "205 Reset Content\r\n";
	MNS::Server::response_msgs[206] = "206 Partial Content\r\n";

	MNS::Server::response_msgs[300] = "300 Multiple Choices\r\n";
	MNS::Server::response_msgs[301] = "301 Moved Permanently\r\n";
	MNS::Server::response_msgs[302] = "302 Found\r\n";
	MNS::Server::response_msgs[303] = "303 See Other\r\n";
	MNS::Server::response_msgs[304] = "304 Not Modified\r\n";
	MNS::Server::response_msgs[306] = "306 Switch Proxy\r\n";
	MNS::Server::response_msgs[307] = "307 Temporary Redirect\r\n";
	MNS::Server::response_msgs[308] = "308 Resume Incomplete\r\n";


	MNS::Server::response_msgs[400] = "400 Bad Request\r\n";
	MNS::Server::response_msgs[401] = "401 Unauthorized\r\n";
	MNS::Server::response_msgs[402] = "402 Payment Required\r\n";
	MNS::Server::response_msgs[403] = "403 Forbidden\r\n";
	MNS::Server::response_msgs[404] = "404 Not Found\r\n";
	MNS::Server::response_msgs[405] = "405 Method Not Allowed\r\n";
	MNS::Server::response_msgs[406] = "406 Not Acceptable\r\n";
	MNS::Server::response_msgs[407] = "407 Proxy Authentication Required\r\n";
	MNS::Server::response_msgs[408] = "408 Request Timeout\r\n";
	MNS::Server::response_msgs[409] = "409 Conflict\r\n";
	MNS::Server::response_msgs[410] = "410 Gone\r\n";
	MNS::Server::response_msgs[411] = "411 Length Required\r\n";
	MNS::Server::response_msgs[412] = "412 Precondition Failed\r\n";
	MNS::Server::response_msgs[413] = "413 Request Entity Too Large\r\n";
	MNS::Server::response_msgs[414] = "414 Request-URI Too Long\r\n";
	MNS::Server::response_msgs[415] = "415 Unsupported Media Type\r\n";
	MNS::Server::response_msgs[416] = "416 Requested Range Not Satisfiable\r\n";
	MNS::Server::response_msgs[417] = "417 Expectation Failed\r\n";

	MNS::Server::response_msgs[500] = "500 Internal Server Error\r\n";
	MNS::Server::response_msgs[501] = "501 Not Implemented\r\n";
	MNS::Server::response_msgs[502] = "502 Bad Gateway\r\n";
	MNS::Server::response_msgs[503] = "503 Service Unavailable\r\n";
	MNS::Server::response_msgs[504] = "504 Gateway Timeout\r\n";
	MNS::Server::response_msgs[505] = "505 HTTP Version Not Supported\r\n";
	MNS::Server::response_msgs[511] = "511 Network Authentication Required\r\n";

	loop = uv_default_loop();

	this->onHttpCancelHandler = NULL;
	this->onHttpConnectionHandler = NULL;
	this->onHttpRequestHandler = NULL;
	this->listeningSocket = 0;
	this->timer_h = NULL;
}